

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsbr_gtest_utils.hpp
# Opt level: O3

void unodb::test::QSBRTestBase::qsbr_deallocate(void *ptr)

{
  unsigned_long uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  __int_type _Var6;
  bool bVar7;
  qsbr *pqVar8;
  char *pcVar9;
  char *in_R9;
  uint uVar10;
  long in_FS_OFFSET;
  debug_callback local_b0;
  unsigned_long local_90;
  AssertHelper local_88;
  bool previous_interval_empty_after;
  undefined7 uStack_7f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  Message local_60;
  size_t current_interval_total_dealloc_size_after_1;
  undefined1 local_4a;
  undefined1 local_49;
  unsigned_long local_48;
  size_t current_interval_total_dealloc_size_after;
  bool local_31 [8];
  bool current_interval_empty_after;
  
  qsbr_per_thread::current_thread_instance::__tls_init();
  uVar1 = *(unsigned_long *)(*(long *)(in_FS_OFFSET + -0x10) + 0x58);
  qsbr_per_thread::current_thread_instance::__tls_init();
  lVar2 = *(long *)(*(long *)(in_FS_OFFSET + -0x10) + 0x20);
  lVar3 = *(long *)(*(long *)(in_FS_OFFSET + -0x10) + 0x28);
  qsbr_per_thread::current_thread_instance::__tls_init();
  lVar4 = *(long *)(*(long *)(in_FS_OFFSET + -0x10) + 0x38);
  lVar5 = *(long *)(*(long *)(in_FS_OFFSET + -0x10) + 0x40);
  qsbr_per_thread::current_thread_instance::__tls_init();
  local_b0.super__Function_base._M_functor._8_8_ = 0;
  local_b0.super__Function_base._M_functor._M_unused._M_object = check_ptr_on_qsbr_dealloc;
  local_b0._M_invoker =
       std::_Function_handler<void_(const_void_*),_void_(*)(const_void_*)_noexcept>::_M_invoke;
  local_b0.super__Function_base._M_manager =
       std::_Function_handler<void_(const_void_*),_void_(*)(const_void_*)_noexcept>::_M_manager;
  local_90 = uVar1;
  local_4a = lVar2 == lVar3;
  local_49 = lVar4 == lVar5;
  qsbr_per_thread::on_next_epoch_deallocate
            (*(qsbr_per_thread **)(in_FS_OFFSET + -0x10),ptr,1,&local_b0);
  if (local_b0.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_b0.super__Function_base._M_manager)
              ((_Any_data *)&local_b0,(_Any_data *)&local_b0,__destroy_functor);
  }
  qsbr_per_thread::current_thread_instance::__tls_init();
  local_48 = *(unsigned_long *)(*(long *)(in_FS_OFFSET + -0x10) + 0x58);
  qsbr_per_thread::current_thread_instance::__tls_init();
  local_31[0] = *(long *)(*(long *)(in_FS_OFFSET + -0x10) + 0x38) ==
                *(long *)(*(long *)(in_FS_OFFSET + -0x10) + 0x40);
  pqVar8 = qsbr::instance();
  _Var6 = (pqVar8->state).super___atomic_base<unsigned_long>._M_i;
  uVar10 = (uint)(_Var6 >> 0x20) & 0x3fffffff;
  if (uVar10 < ((uint)_Var6 & 0x3fffffff)) {
    __assert_fail("threads_in_previous <= thread_count",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./qsbr.hpp"
                  ,0x19b,"static void unodb::qsbr_state::assert_invariants(type)");
  }
  local_60.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ =
       CONCAT31(local_60.ss_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._1_3_,local_48 == 0);
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&previous_interval_empty_after,"(current_interval_empty_after)",
             "((current_interval_total_dealloc_size_after == 0))",local_31,(bool *)&local_60);
  if (previous_interval_empty_after == false) {
    testing::Message::Message(&local_60);
    if (local_78 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar9 = "";
    }
    else {
      pcVar9 = (local_78->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&current_interval_total_dealloc_size_after,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/qsbr_gtest_utils.hpp"
               ,0xd3,pcVar9);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&current_interval_total_dealloc_size_after,&local_60);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)&current_interval_total_dealloc_size_after);
    if ((long *)CONCAT44(local_60.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         local_60.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_60.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     local_60.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_4_) + 8))();
    }
  }
  if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_78,local_78);
  }
  if (uVar10 < 2) {
    bVar7 = local_48 == 0 || local_90 == local_48;
    local_60.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ =
         CONCAT31(local_60.ss_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._1_3_,bVar7);
    current_interval_total_dealloc_size_after_1 = 0;
    if (bVar7) {
      return;
    }
    testing::Message::Message((Message *)&current_interval_total_dealloc_size_after);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&previous_interval_empty_after,(internal *)&local_60,
               (AssertionResult *)
               "current_interval_total_dealloc_size_before == current_interval_total_dealloc_size_after || current_interval_total_dealloc_size_after == 0"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/qsbr_gtest_utils.hpp"
               ,0xd7,(char *)CONCAT71(uStack_7f,previous_interval_empty_after));
    testing::internal::AssertHelper::operator=
              (&local_88,(Message *)&current_interval_total_dealloc_size_after);
  }
  else {
    local_60.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ = 0;
    testing::internal::CmpHelperGT<unsigned_long,int>
              ((internal *)&previous_interval_empty_after,
               "(current_interval_total_dealloc_size_after)","(0)",&local_48,(int *)&local_60);
    if (previous_interval_empty_after == false) {
      testing::Message::Message(&local_60);
      if (local_78 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar9 = "";
      }
      else {
        pcVar9 = (local_78->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&current_interval_total_dealloc_size_after,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/qsbr_gtest_utils.hpp"
                 ,0xd9,pcVar9);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&current_interval_total_dealloc_size_after,&local_60);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)&current_interval_total_dealloc_size_after);
      if ((long *)CONCAT44(local_60.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._4_4_,
                           local_60.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_60.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._4_4_,
                                       local_60.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._0_4_) + 8))();
      }
    }
    if (local_78 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_78,local_78);
    }
    bVar7 = local_48 == local_90 + 1 || local_48 == 1;
    local_60.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ =
         CONCAT31(local_60.ss_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._1_3_,bVar7);
    current_interval_total_dealloc_size_after_1 = 0;
    if (bVar7) {
      return;
    }
    testing::Message::Message((Message *)&current_interval_total_dealloc_size_after);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&previous_interval_empty_after,(internal *)&local_60,
               (AssertionResult *)
               "current_interval_total_dealloc_size_after == 1 || (current_interval_total_dealloc_size_after == current_interval_total_dealloc_size_before + 1)"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/qsbr_gtest_utils.hpp"
               ,0xdc,(char *)CONCAT71(uStack_7f,previous_interval_empty_after));
    testing::internal::AssertHelper::operator=
              (&local_88,(Message *)&current_interval_total_dealloc_size_after);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(uStack_7f,previous_interval_empty_after) != &local_70) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(uStack_7f,previous_interval_empty_after),
                    local_70._M_allocated_capacity + 1);
  }
  if (current_interval_total_dealloc_size_after != 0) {
    (**(code **)(*(long *)current_interval_total_dealloc_size_after + 8))();
  }
  if (current_interval_total_dealloc_size_after_1 != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&current_interval_total_dealloc_size_after_1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 current_interval_total_dealloc_size_after_1);
  }
  return;
}

Assistant:

static void qsbr_deallocate(void *ptr) {
#ifdef UNODB_DETAIL_WITH_STATS
    const auto current_interval_total_dealloc_size_before =
        unodb::this_thread().get_current_interval_total_dealloc_size();
#endif  // UNODB_DETAIL_WITH_STATS
    const auto previous_interval_empty_before =
        unodb::this_thread().previous_interval_requests_empty();
    const auto current_interval_empty_before =
        unodb::this_thread().current_interval_requests_empty();

    try {
      unodb::this_thread().on_next_epoch_deallocate(ptr
#ifdef UNODB_DETAIL_WITH_STATS
                                                    ,
                                                    1
#endif
#ifndef NDEBUG
                                                    ,
                                                    check_ptr_on_qsbr_dealloc
#endif
      );
    } catch (...) {
      const auto previous_interval_empty_after =
          unodb::this_thread().previous_interval_requests_empty();
      const auto current_interval_empty_after =
          unodb::this_thread().current_interval_requests_empty();
#ifdef UNODB_DETAIL_WITH_STATS
      const auto current_interval_total_dealloc_size_after =
          unodb::this_thread().get_current_interval_total_dealloc_size();
      UNODB_EXPECT_EQ(current_interval_total_dealloc_size_before,
                      current_interval_total_dealloc_size_after);
#endif  // UNODB_DETAIL_WITH_STATS
      UNODB_EXPECT_EQ(previous_interval_empty_before,
                      previous_interval_empty_after);
      UNODB_EXPECT_EQ(current_interval_empty_before,
                      current_interval_empty_after);
      throw;
    }

#ifdef UNODB_DETAIL_WITH_STATS
    const auto current_interval_total_dealloc_size_after =
        unodb::this_thread().get_current_interval_total_dealloc_size();
    const auto current_interval_empty_after =
        unodb::this_thread().current_interval_requests_empty();
    const auto single_thread_mode =
        qsbr_state::single_thread_mode(qsbr::instance().get_state());
    UNODB_EXPECT_EQ(current_interval_empty_after,
                    (current_interval_total_dealloc_size_after == 0));
    if (single_thread_mode) {
      UNODB_EXPECT_TRUE(current_interval_total_dealloc_size_before ==
                            current_interval_total_dealloc_size_after ||
                        current_interval_total_dealloc_size_after == 0);
    } else {
      UNODB_EXPECT_GT(current_interval_total_dealloc_size_after, 0);
      UNODB_EXPECT_TRUE(current_interval_total_dealloc_size_after == 1 ||
                        (current_interval_total_dealloc_size_after ==
                         current_interval_total_dealloc_size_before + 1));
    }
#endif  // UNODB_DETAIL_WITH_STATS
  }